

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O1

int ssl_parse_client_dh_public(mbedtls_ssl_context *ssl,uchar **p,uchar *end)

{
  ushort *input;
  ushort uVar1;
  int iVar2;
  int iVar3;
  ulong ilen;
  
  input = (ushort *)((long)*p + 2);
  iVar2 = -0x7c00;
  if (input <= end) {
    uVar1 = *(ushort *)*p;
    ilen = (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8);
    *p = (uchar *)input;
    if ((uchar *)((long)input + ilen) <= end) {
      iVar3 = mbedtls_dhm_read_public(&ssl->handshake->dhm_ctx,(uchar *)input,ilen);
      iVar2 = -0x7c80;
      if (iVar3 == 0) {
        *p = *p + ilen;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int ssl_parse_client_dh_public( mbedtls_ssl_context *ssl, unsigned char **p,
                                       const unsigned char *end )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    size_t n;

    /*
     * Receive G^Y mod P, premaster = (G^Y)^X mod P
     */
    if( *p + 2 > end )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
    }

    n = ( (*p)[0] << 8 ) | (*p)[1];
    *p += 2;

    if( *p + n > end )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
    }

    if( ( ret = mbedtls_dhm_read_public( &ssl->handshake->dhm_ctx, *p, n ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_dhm_read_public", ret );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE_RP );
    }

    *p += n;

    MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: GY", &ssl->handshake->dhm_ctx.GY );

    return( ret );
}